

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void descrCommand(FILE *outf,char *hdr1,char *hdr2,int argc,char **argv)

{
  tm *__tp;
  char *pcVar1;
  char *__format;
  int dontQuote;
  char *ts;
  time_t t;
  char **ppcStack_30;
  int i;
  char **argv_local;
  char *pcStack_20;
  int argc_local;
  char *hdr2_local;
  char *hdr1_local;
  FILE *outf_local;
  
  t._4_4_ = 0;
  ppcStack_30 = argv;
  argv_local._4_4_ = argc;
  pcStack_20 = hdr2;
  hdr2_local = hdr1;
  hdr1_local = (char *)outf;
  ts = (char *)time((time_t *)0x0);
  __tp = localtime((time_t *)&ts);
  pcVar1 = asctime(__tp);
  fprintf((FILE *)hdr1_local,"%s %s, run %s",hdr2_local,shortVersionStr,pcVar1);
  fprintf((FILE *)hdr1_local,"%s %s",pcStack_20,*ppcStack_30);
  for (t._4_4_ = 1; t._4_4_ < argv_local._4_4_; t._4_4_ = t._4_4_ + 1) {
    pcVar1 = strpbrk(ppcStack_30[t._4_4_]," \t\n\b\r\v\f\a*\'");
    __format = " \"%s\"";
    if (pcVar1 == (char *)0x0) {
      __format = " %s";
    }
    fprintf((FILE *)hdr1_local,__format,ppcStack_30[t._4_4_]);
  }
  fprintf((FILE *)hdr1_local,"\n");
  return;
}

Assistant:

void descrCommand(FILE *outf, char *hdr1, char *hdr2, int argc, char **argv)
{
   int i = 0;
   time_t t;
   char *ts = NULL;

   t = time(NULL);
   ts = asctime(localtime(&t)); /* system dependent time string */

   fprintf(outf, "%s %s, run %s", hdr1, shortVersionStr, ts);
   fprintf(outf, "%s %s", hdr2, argv[0]);
   for (i = 1; i < argc; i++) {
      int dontQuote = (strpbrk(argv[i], " \t\n\b\r\v\f\a*\'") == NULL);
      fprintf(outf,(dontQuote?" %s":" \"%s\""), argv[i]);
   }
   fprintf(outf, "\n");
}